

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::ContractionsAndExpansions::addExpansions
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end)

{
  UBool UVar1;
  UChar32 end_local;
  UChar32 start_local;
  ContractionsAndExpansions *this_local;
  
  UVar1 = UnicodeString::isEmpty(&this->unreversedPrefix);
  if ((UVar1 == '\0') || (this->suffix != (UnicodeString *)0x0)) {
    addStrings(this,start,end,this->expansions);
  }
  else if (this->expansions != (UnicodeSet *)0x0) {
    UnicodeSet::add(this->expansions,start,end);
  }
  return;
}

Assistant:

void
ContractionsAndExpansions::addExpansions(UChar32 start, UChar32 end) {
    if(unreversedPrefix.isEmpty() && suffix == NULL) {
        if(expansions != NULL) {
            expansions->add(start, end);
        }
    } else {
        addStrings(start, end, expansions);
    }
}